

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

tidyLocaleMapItemImpl * prvTidygetNextWindowsLanguage(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator p_Var2;
  _html5Info *p_Var3;
  TidyIterator p_Var4;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var4 = *iter;
    if (p_Var4 == (TidyIterator)0x0) {
      p_Var3 = (_html5Info *)0x0;
      p_Var4 = (TidyIterator)0x0;
    }
    else {
      uVar1 = tidyLanguageListSize();
      if ((TidyIterator)(ulong)uVar1 < p_Var4) {
        p_Var3 = (_html5Info *)0x0;
      }
      else {
        p_Var3 = html5Info + (long)(p_Var4 + 3);
        p_Var4 = (TidyIterator)((long)&p_Var4->_opaque + 1);
      }
    }
    uVar1 = tidyLanguageListSize();
    p_Var2 = (TidyIterator)0x0;
    if (p_Var4 <= (TidyIterator)(ulong)uVar1) {
      p_Var2 = p_Var4;
    }
    *iter = p_Var2;
    return (tidyLocaleMapItemImpl *)p_Var3;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/language.c"
                ,0x24e,"const tidyLocaleMapItemImpl *prvTidygetNextWindowsLanguage(TidyIterator *)")
  ;
}

Assistant:

TY_PRIVATE const tidyLocaleMapItemImpl *TY_(getNextWindowsLanguage)( TidyIterator *iter )
{
    const tidyLocaleMapItemImpl *item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyLanguageListSize() )
    {
        item = &localeMappings[ itemIndex -1 ];
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyLanguageListSize() ? itemIndex : (size_t)0 );
    return item;
}